

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::SubtractPropagateStatistics::Operation<short,duckdb::TryDecimalSubtract>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  short max;
  short min;
  short local_74;
  short local_72;
  Value local_70;
  
  sVar2 = NumericStats::GetMin<short>(lstats);
  sVar3 = NumericStats::GetMax<short>(rstats);
  bVar1 = TryDecimalSubtractTemplated<short,_(short)_9999,_(short)9999>(sVar2,sVar3,&local_72);
  bVar4 = true;
  if (bVar1) {
    sVar2 = NumericStats::GetMax<short>(lstats);
    sVar3 = NumericStats::GetMin<short>(rstats);
    bVar1 = TryDecimalSubtractTemplated<short,_(short)_9999,_(short)9999>(sVar2,sVar3,&local_74);
    if (bVar1) {
      Value::Numeric(&local_70,type,(long)local_72);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,(long)local_74);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}